

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_appendAString_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *local_98;
  undefined8 uStack_90;
  AString srcString;
  AString destString;
  
  destString.reallocator._0_4_ = 0x11e238;
  destString.reallocator._4_4_ = 0;
  destString.deallocator._0_4_ = 0x11e278;
  destString.deallocator._4_4_ = 0;
  destString.buffer = (char *)0x0;
  destString.size = 5;
  destString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x12c73b;
  destString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(destString.buffer,"01234",6);
  srcString.buffer = (char *)0x0;
  srcString.reallocator._0_4_ = 0x11e238;
  srcString.reallocator._4_4_ = 0;
  srcString.deallocator._0_4_ = 0x11e278;
  srcString.deallocator._4_4_ = 0;
  srcString.size = 4;
  srcString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x12c79b;
  srcString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(srcString.buffer,"5678",5);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x12c7d0;
  bVar1 = AString_appendAString(&destString,&srcString);
  if (bVar1 == false) {
    uStack_90 = 0x12c96a;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x415,"Assertion \'AString_appendAString(&destString, &srcString)\' failed",0
                      ,0);
  }
  uStack_90 = 0x12c7e9;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x415);
  if (destString.capacity != 0x10) {
    pcStack_a0 = "(16)";
    pcVar6 = "(destString).capacity == (16)";
    pcVar7 = "(destString).capacity";
    iVar2 = 0x416;
    local_98 = (char *)0x10;
    pcVar8 = (char *)destString.capacity;
    goto LAB_0012cbb4;
  }
  uStack_90 = 0x12c809;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x416);
  if (destString.buffer == (char *)0x0) {
    pcVar7 = "(void*) (destString).buffer != NULL";
    pcVar8 = "(void*) (destString).buffer";
    iVar2 = 0x416;
LAB_0012cadc:
    uStack_90 = 0;
    local_98 = (char *)0x0;
    pcStack_a0 = (char *)0x12cae3;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x",pcVar7,pcVar8);
  }
  uStack_90 = 0x12c826;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x416);
  pcVar4 = destString.buffer;
  if (destString.buffer == (char *)0x0) {
    pcVar8 = "";
    pcVar4 = "(null)";
LAB_0012c9f3:
    pcStack_a0 = "012345678";
    pcStack_b0 = "(\"012345678\")";
    pcVar6 = "(destString).buffer == (\"012345678\")";
    pcVar7 = "(void*) (destString).buffer";
    iVar2 = 0x416;
  }
  else {
    uStack_90 = 0x12c843;
    iVar2 = strcmp("012345678",destString.buffer);
    if (iVar2 != 0) {
      pcVar8 = "\"";
      goto LAB_0012c9f3;
    }
    uStack_90 = 0x12c85c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x416);
    if (destString.size != 9) {
      pcStack_a0 = "strlen(\"012345678\")";
      pcVar6 = "(destString).size == strlen(\"012345678\")";
      pcVar7 = "(destString).size";
      iVar2 = 0x416;
      local_98 = (char *)0x9;
      pcVar8 = (char *)destString.size;
LAB_0012cbb4:
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      ppcVar5 = &pcStack_a0;
      goto LAB_0012cbb6;
    }
    uStack_90 = 0x12c87c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x416);
    if (srcString.capacity != 8) {
      pcStack_a0 = "(8)";
      pcVar6 = "(srcString).capacity == (8)";
      pcVar7 = "(srcString).capacity";
      iVar2 = 0x417;
      local_98 = (char *)0x8;
      pcVar8 = (char *)srcString.capacity;
      goto LAB_0012cbb4;
    }
    uStack_90 = 0x12c89c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x417);
    if (srcString.buffer == (char *)0x0) {
      pcVar7 = "(void*) (srcString).buffer != NULL";
      pcVar8 = "(void*) (srcString).buffer";
      iVar2 = 0x417;
      goto LAB_0012cadc;
    }
    uStack_90 = 0x12c8b9;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x417);
    pcVar4 = srcString.buffer;
    if (srcString.buffer == (char *)0x0) {
      pcVar4 = "(null)";
      pcVar8 = "";
    }
    else {
      uStack_90 = 0x12c8d6;
      iVar2 = strcmp("5678",srcString.buffer);
      if (iVar2 == 0) {
        uStack_90 = 0x12c8ef;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x417);
        if (srcString.size == 4) {
          uStack_90 = 0x12c90f;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x417);
          if (private_ACUtilsTest_AString_reallocCount == 1) {
            uStack_90 = 0x12c931;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x418);
            uStack_90 = 0x12c93a;
            (*(code *)CONCAT44(destString.deallocator._4_4_,destString.deallocator._0_4_))
                      (destString.buffer);
            uStack_90 = 0x12c943;
            (*(code *)CONCAT44(srcString.deallocator._4_4_,srcString.deallocator._0_4_))
                      (srcString.buffer);
            return;
          }
          pcStack_a0 = "(1)";
          pcVar6 = "private_ACUtilsTest_AString_reallocCount == (1)";
          pcVar7 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x418;
          local_98 = (char *)0x1;
          pcVar8 = (char *)private_ACUtilsTest_AString_reallocCount;
        }
        else {
          pcStack_a0 = "strlen(\"5678\")";
          pcVar6 = "(srcString).size == strlen(\"5678\")";
          pcVar7 = "(srcString).size";
          iVar2 = 0x417;
          local_98 = (char *)0x4;
          pcVar8 = (char *)srcString.size;
        }
        goto LAB_0012cbb4;
      }
      pcVar8 = "\"";
    }
    pcStack_a0 = "5678";
    pcStack_b0 = "(\"5678\")";
    pcVar6 = "(srcString).buffer == (\"5678\")";
    pcVar7 = "(void*) (srcString).buffer";
    iVar2 = 0x417;
  }
  pcVar7 = pcVar7 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_98 = "\"";
  pcStack_a8 = "\"";
  ppcVar5 = &pcStack_c0;
  pcStack_c0 = pcVar4;
  pcStack_b8 = pcVar8;
LAB_0012cbb6:
  uStack_90 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) = test_AString_appendAString_success_nullptrSrcArray_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_appendAString_success_notEnoughCapacity)
{
    struct AString destString = private_ACUtilsTest_AString_constructTestString("01234", 8);
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("5678", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_appendAString(&destString, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(destString, "012345678", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "5678", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(destString);
    private_ACUtilsTest_AString_destructTestString(srcString);
}